

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O0

errc psql::deserialize_struct<0ul,psql::empty_message<(unsigned_char)49>>
               (empty_message<(unsigned_char)_1_> *output,deserialization_context *ctx)

{
  tuple<> fields;
  deserialization_context *ctx_local;
  empty_message<(unsigned_char)_1_> *output_local;
  
  return ok;
}

Assistant:

errc deserialize_struct(
	[[maybe_unused]] T& output,
	[[maybe_unused]] deserialization_context& ctx
) noexcept
{
	constexpr auto fields = get_struct_fields<T>::value;
	if constexpr (index == std::tuple_size<decltype(fields)>::value)
	{
		return errc::ok;
	}
	else
	{
		constexpr auto pmem = std::get<index>(fields);
		errc err = deserialize(output.*pmem, ctx);
		if (err != errc::ok)
		{
			return err;
		}
		else
		{
			return deserialize_struct<index+1>(output, ctx);
		}
	}
}